

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O3

void __thiscall MatroskaDemuxer::openFile(MatroskaDemuxer *this,string *streamName)

{
  AbstractReader *pAVar1;
  int iVar2;
  undefined4 *puVar3;
  ostringstream ss;
  uint *local_1b0;
  undefined8 local_1a8;
  uint local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  ostringstream local_190 [376];
  
  readClose(this);
  pAVar1 = (this->super_IOContextDemuxer).m_bufferedReader;
  iVar2 = (*pAVar1->_vptr_AbstractReader[8])
                    (pAVar1,(ulong)(uint)(this->super_IOContextDemuxer).m_readerID,
                     (streamName->_M_dataplus)._M_p,0,0);
  if ((char)iVar2 != '\0') {
    (this->super_IOContextDemuxer).m_processedBytes = 0;
    this->num_streams = 0;
    this->segment_start = 0;
    this->time_scale = 0;
    (this->super_IOContextDemuxer).m_curPos = (uint8_t *)0x0;
    (this->super_IOContextDemuxer).m_bufEnd = (uint8_t *)0x0;
    (this->super_IOContextDemuxer).m_isEOF = false;
    this->num_levels = 0;
    this->level_up = 0;
    *(undefined8 *)((long)&this->level_up + 1) = 0;
    std::
    _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
    ::clear(&(this->m_firstTimecode)._M_t);
    this->index_parsed = false;
    this->metadata_parsed = false;
    (this->super_IOContextDemuxer).num_tracks = 0;
    this->writing_app = (char *)0x0;
    this->muxing_app = (char *)0x0;
    matroska_read_header(this);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Can\'t open stream ",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,(streamName->_M_dataplus)._M_p,streamName->_M_string_length);
  puVar3 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar3 = 100;
  *(undefined4 **)(puVar3 + 2) = puVar3 + 6;
  if (local_1b0 == &local_1a0) {
    puVar3[6] = local_1a0;
    puVar3[7] = uStack_19c;
    puVar3[8] = uStack_198;
    puVar3[9] = uStack_194;
  }
  else {
    *(uint **)(puVar3 + 2) = local_1b0;
    *(ulong *)(puVar3 + 6) = CONCAT44(uStack_19c,local_1a0);
  }
  *(undefined8 *)(puVar3 + 4) = local_1a8;
  local_1a0 = local_1a0 & 0xffffff00;
  __cxa_throw(puVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

void MatroskaDemuxer::openFile(const std::string &streamName)
{
    readClose();
    if (!m_bufferedReader->openStream(m_readerID, streamName.c_str()))
        THROW(ERR_FILE_NOT_FOUND, "Can't open stream " << streamName)
    m_curPos = m_bufEnd = nullptr;
    m_processedBytes = 0;
    m_isEOF = false;

    num_levels = 0;
    level_up = 0;
    peek_id = 0;
    done = false;
    num_streams = 0;

    segment_start = 0;
    time_scale = 0;
    m_firstTimecode.clear();
    index_parsed = false;
    metadata_parsed = false;

    writing_app = nullptr;
    muxing_app = nullptr;
    num_tracks = 0;
    matroska_read_header();
}